

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int io_type(lua_State *L)

{
  StkId pTVar1;
  int iVar2;
  TValue *pTVar3;
  size_t len;
  char *s;
  GCObject *pGVar4;
  
  luaL_checkany(L,1);
  pTVar3 = &luaO_nilobject_;
  if (L->base < L->top) {
    pTVar3 = L->base;
  }
  if (pTVar3->tt == 2) {
    pGVar4 = (pTVar3->value).gc;
  }
  else if (pTVar3->tt == 7) {
    pGVar4 = (GCObject *)&(((pTVar3->value).gc)->h).lastfree;
  }
  else {
    pGVar4 = (GCObject *)0x0;
  }
  iVar2 = -10000;
  lua_getfield(L,-10000,"FILE*");
  if (((pGVar4 != (GCObject *)0x0) && (iVar2 = lua_getmetatable(L,iVar2), iVar2 != 0)) &&
     (iVar2 = lua_rawequal(L,-2,-1), iVar2 != 0)) {
    if ((pGVar4->gch).next == (GCObject *)0x0) {
      s = "closed file";
      len = 0xb;
    }
    else {
      s = "file";
      len = 4;
    }
    lua_pushlstring(L,s,len);
    return 1;
  }
  pTVar1 = L->top;
  pTVar1->tt = 0;
  L->top = pTVar1 + 1;
  return 1;
}

Assistant:

static int io_type(lua_State*L){
void*ud;
luaL_checkany(L,1);
ud=lua_touserdata(L,1);
lua_getfield(L,(-10000),"FILE*");
if(ud==NULL||!lua_getmetatable(L,1)||!lua_rawequal(L,-2,-1))
lua_pushnil(L);
else if(*((FILE**)ud)==NULL)
lua_pushliteral(L,"closed file");
else
lua_pushliteral(L,"file");
return 1;
}